

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O1

int Abc_TtCofsOppositeWithMask(word *pTruth,word *pMask,int nWords,int iVar)

{
  ulong *puVar1;
  byte bVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  if (iVar < 6) {
    if (0 < nWords) {
      uVar7 = 0;
      do {
        if ((pMask[uVar7] &
            ~(pTruth[uVar7] << ((byte)(1 << ((byte)iVar & 0x1f)) & 0x3f) ^ pTruth[uVar7]) &
            s_Truths6[iVar]) != 0) {
          return 0;
        }
        uVar7 = uVar7 + 1;
      } while ((uint)nWords != uVar7);
    }
  }
  else if (0 < nWords) {
    bVar2 = (byte)iVar - 6;
    uVar5 = (ulong)(uint)(1 << (bVar2 & 0x1f));
    puVar1 = pTruth + nWords;
    uVar6 = 2 << (bVar2 & 0x1f);
    uVar7 = uVar5;
    puVar4 = pTruth;
    puVar3 = pMask;
    do {
      do {
        if ((*pMask & *pTruth) != (~pTruth[uVar5] & pMask[uVar5])) {
          return 0;
        }
        pMask = pMask + 1;
        pTruth = pTruth + 1;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
      pTruth = puVar4 + uVar6;
      pMask = puVar3 + uVar6;
      uVar7 = uVar5;
      puVar4 = pTruth;
      puVar3 = pMask;
    } while (pTruth < puVar1);
    return 1;
  }
  return 1;
}

Assistant:

static int Abc_TtCofsOppositeWithMask( word * pTruth, word * pMask, int nWords, int iVar )
{
    if ( iVar < 6 )
    {
        int w, Shift = ( 1 << iVar );
        for ( w = 0; w < nWords; ++w )
            if ( ( ( pTruth[w] << Shift ) & s_Truths6[iVar] & pMask[w] ) != ( ~pTruth[w] & s_Truths6[iVar] & pMask[w] ) )
                return 0;
        return 1;
    }
    else
    {
        int w, Step = ( 1 << ( iVar - 6 ) );
        word * p = pTruth, * m = pMask, * pLimit = pTruth + nWords;
        for ( ; p < pLimit; p += 2 * Step, m += 2 * Step )
            for ( w = 0; w < Step; ++w )
                if ( ( p[w] & m[w] ) != ( ~p[w + Step] & m[w + Step] ) )
                    return 0;
        return 1;
    }
}